

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall CaDiCaL::Proof::flush_clause(Proof *this,Clause *c)

{
  uint lit;
  int iVar1;
  unsigned_long in_RAX;
  uint uVar2;
  int i;
  long lVar3;
  char cVar4;
  Clause *pCVar5;
  uint64_t id;
  unsigned_long local_38;
  
  cVar4 = '\x01';
  if (this->internal->lrat == false) {
    cVar4 = this->internal->frat;
  }
  local_38 = in_RAX;
  for (lVar3 = 0; lVar3 < c->size; lVar3 = lVar3 + 1) {
    lit = *(uint *)((long)&c[1].field_0 + lVar3 * 4);
    iVar1 = Internal::fixed(this->internal,lit);
    if (iVar1 < 0) {
      if (cVar4 != '\0') {
        uVar2 = lit;
        if ((int)lit < 1) {
          uVar2 = -lit;
        }
        local_38 = (this->internal->unit_clauses_idx).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)(uVar2 << 1 | -lit >> 0x1f)];
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->proof_chain,&local_38);
      }
    }
    else {
      add_literal(this,lit);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->proof_chain,(value_type_conflict5 *)c);
  this->redundant = (bool)((byte)(*(uint *)&c->field_0x8 >> 0xb) & 1);
  pCVar5 = (Clause *)(this->internal->clause_id + 1);
  this->internal->clause_id = (uint64_t)pCVar5;
  this->clause_id = (uint64_t)pCVar5;
  add_derived_clause(this);
  delete_clause(this,c);
  (c->field_0).copy = pCVar5;
  return;
}

Assistant:

void Proof::flush_clause (Clause *c) {
  LOG (c, "PROOF flushing falsified literals in");
  assert (clause.empty ());
  const bool antecedents = (internal->lrat || internal->frat);
  for (int i = 0; i < c->size; i++) {
    int internal_lit = c->literals[i];
    if (internal->fixed (internal_lit) < 0) {
      if (antecedents) {
        const unsigned uidx = internal->vlit (-internal_lit);
        uint64_t id = internal->unit_clauses (uidx);
        assert (id);
        proof_chain.push_back (id);
      }
      continue;
    }
    add_literal (internal_lit);
  }
  proof_chain.push_back (c->id);
  redundant = c->redundant;
  int64_t id = ++internal->clause_id;
  clause_id = id;
  add_derived_clause ();
  delete_clause (c);
  c->id = id;
}